

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O3

int Fra_ImpVerifyUsingSimulation(Fra_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Fra_Sml_t *p_00;
  void *__ptr;
  int iVar5;
  int iVar6;
  size_t sVar7;
  undefined1 uVar8;
  size_t __size;
  long lVar9;
  
  pVVar3 = p->pCla->vImps;
  if (pVVar3 == (Vec_Int_t *)0x0) {
    return 0;
  }
  if (pVVar3->nSize == 0) {
    return 0;
  }
  p_00 = Fra_SmlSimulateSeq(p->pManAig,p->pPars->nFramesP,2000,8,1);
  pVVar3 = p->pCla->vImps;
  iVar5 = pVVar3->nSize;
  __size = (size_t)iVar5;
  __ptr = calloc(1,__size);
  if ((long)__size < 1) {
    iVar6 = 0;
    iVar5 = 0;
    if (__ptr == (void *)0x0) goto LAB_00698199;
  }
  else {
    piVar4 = pVVar3->pArray;
    iVar6 = p_00->nWordsTotal;
    iVar1 = p_00->nWordsPref;
    sVar7 = 0;
    do {
      if (iVar1 < iVar6) {
        uVar2 = piVar4[sVar7];
        lVar9 = 0;
        do {
          if ((*(uint *)((long)&p_00[1].pAig +
                        lVar9 * 4 + (long)(int)((uVar2 & 0xffff) * iVar6) * 4 + (long)iVar1 * 4) &
              ~*(uint *)((long)&p_00[1].pAig +
                        lVar9 * 4 + (long)(((int)uVar2 >> 0x10) * iVar6) * 4 + (long)iVar1 * 4)) !=
              0) {
            uVar8 = 1;
            goto LAB_00698161;
          }
          lVar9 = lVar9 + 1;
        } while (iVar6 - iVar1 != (int)lVar9);
      }
      uVar8 = 0;
LAB_00698161:
      *(undefined1 *)((long)__ptr + sVar7) = uVar8;
      sVar7 = sVar7 + 1;
    } while (sVar7 != __size);
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    else {
      sVar7 = 0;
      iVar5 = 0;
      do {
        iVar5 = iVar5 + *(char *)((long)__ptr + sVar7);
        sVar7 = sVar7 + 1;
      } while (__size != sVar7);
    }
  }
  iVar6 = iVar5;
  free(__ptr);
LAB_00698199:
  Fra_SmlStop(p_00);
  return iVar6;
}

Assistant:

int Fra_ImpVerifyUsingSimulation( Fra_Man_t * p )
{
    int nFrames = 2000;
    int nSimWords = 8;
    Fra_Sml_t * pSeq;
    char * pfFails;
    int Left, Right, Imp, i, Counter;
    if ( p->pCla->vImps == NULL || Vec_IntSize(p->pCla->vImps) == 0 )
        return 0;
    // simulate the AIG manager with combinational patterns
    pSeq = Fra_SmlSimulateSeq( p->pManAig, p->pPars->nFramesP, nFrames, nSimWords, 1  );
    // go through the implications and check how many of them do not hold
    pfFails = ABC_ALLOC( char, Vec_IntSize(p->pCla->vImps) );
    memset( pfFails, 0, sizeof(char) * Vec_IntSize(p->pCla->vImps) );
    Vec_IntForEachEntry( p->pCla->vImps, Imp, i )
    {
        Left = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        pfFails[i] = !Sml_NodeCheckImp( pSeq, Left, Right );
    }
    // count how many has failed
    Counter = 0;
    for ( i = 0; i < Vec_IntSize(p->pCla->vImps); i++ )
        Counter += pfFails[i];
    ABC_FREE( pfFails );
    Fra_SmlStop( pSeq );
    return Counter;
}